

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowRowNumberLocalState::Finalize
          (WindowRowNumberLocalState *this,WindowExecutorGlobalState *gstate,
          CollectionPtr collection)

{
  bool bVar1;
  WindowExecutorGlobalState *in_RDX;
  WindowExecutorLocalState *in_RSI;
  CollectionPtr in_RDI;
  WindowMergeSortTreeLocalState *local_tokens;
  
  WindowExecutorLocalState::Finalize(in_RSI,in_RDX,in_RDI);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
                      *)0x1a420c7);
  if (bVar1) {
    unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
    ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                  *)in_RDI.ptr);
    WindowAggregatorState::Cast<duckdb::WindowMergeSortTreeLocalState>
              ((WindowAggregatorState *)in_RDI.ptr);
    WindowMergeSortTreeLocalState::Sort((WindowMergeSortTreeLocalState *)in_RDI.ptr);
    WindowMergeSortTree::Build((WindowMergeSortTree *)in_RDI.ptr);
  }
  return;
}

Assistant:

void WindowRowNumberLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	WindowExecutorBoundsState::Finalize(gstate, collection);

	if (local_tree) {
		auto &local_tokens = local_tree->Cast<WindowMergeSortTreeLocalState>();
		local_tokens.Sort();
		local_tokens.window_tree.Build();
	}
}